

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GPUShaderFP64Test4::verifyProgramInterfaceQuerySupport(GPUShaderFP64Test4 *this)

{
  GLuint GVar1;
  ulong uVar2;
  _stage_data *p_Var3;
  bool bVar4;
  bool bVar5;
  GLint GVar6;
  GLint GVar7;
  bool bVar8;
  int iVar9;
  deUint32 dVar10;
  undefined4 uVar11;
  undefined4 extraout_var;
  char *pcVar13;
  long *plVar14;
  size_t sVar15;
  TestError *this_00;
  ulong uVar16;
  TestLog *pTVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  string *this_01;
  GLuint GVar19;
  ulong uVar20;
  long lVar21;
  GLint max_uniform_name_length;
  GLint retrieved_name_length;
  GLint n_written_items;
  ulong local_548;
  GLint temp_buffer [2];
  GLenum properties [2];
  long local_510 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_500;
  char **local_4f8;
  _stage_data **local_4f0;
  ulong local_4e8;
  _stage_data *cs_stages [1];
  _program_interface_query_test_item uniforms [16];
  undefined1 local_1d8 [8];
  undefined1 local_1d0 [8];
  TestLog local_1c8;
  long lStack_1c0;
  ios_base local_160 [264];
  _stage_data *noncs_stages [5];
  long lVar12;
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar9);
  cs_stages[0] = &this->m_data_cs;
  noncs_stages[0] = &this->m_data_fs;
  noncs_stages[1] = &this->m_data_gs;
  noncs_stages[2] = &this->m_data_tc;
  noncs_stages[3] = &this->m_data_te;
  noncs_stages[4] = &this->m_data_vs;
  uVar2._0_4_ = this->m_po_cs_id;
  uVar2._4_4_ = this->m_po_noncs_id;
  local_500 = &uniforms[3].name.field_2;
  bVar5 = true;
  bVar8 = true;
  uVar20 = uVar2;
  do {
    GVar1 = this->m_po_cs_id;
    GVar19 = (GLuint)uVar20;
    local_4f0 = cs_stages;
    if (GVar19 != GVar1) {
      local_4f0 = noncs_stages;
    }
    local_4f8 = initProgramObjects::cs_uniform_prefixes;
    if (GVar19 != GVar1) {
      local_4f8 = initProgramObjects::noncs_uniform_prefixes;
    }
    if (GVar19 != 0) {
      max_uniform_name_length = 0;
      (**(code **)(lVar12 + 0x990))(uVar20 & 0xffffffff,0x92e1,0x92f6,&max_uniform_name_length);
      dVar10 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar10,"glGetProgramInterfaceiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x1a93);
      pcVar13 = (char *)operator_new__((long)max_uniform_name_length);
      this->m_uniform_name_buffer = pcVar13;
      uVar16 = 0;
      local_548 = uVar20;
      do {
        p_Var3 = local_4f0[uVar16];
        pcVar13 = local_4f8[uVar16];
        uniforms[0].expected_array_size = 1;
        uniforms[0].name._M_dataplus._M_p = (pointer)&uniforms[0].name.field_2;
        local_4e8 = uVar16;
        std::__cxx11::string::_M_construct<char_const*>((string *)&uniforms[0].name,"double","");
        uniforms[0].expected_type = 0x140a;
        uniforms[0].location = (p_Var3->uniforms).uniform_location_double;
        uniforms[1].expected_array_size = 2;
        uniforms[1].name._M_dataplus._M_p = (pointer)&uniforms[1].name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&uniforms[1].name,"double_arr[0]","");
        uniforms[1].expected_type = 0x140a;
        uniforms[1].location = (p_Var3->uniforms).uniform_location_double_arr[0];
        uniforms[2].expected_array_size = 1;
        uniforms[2].name._M_dataplus._M_p = (pointer)&uniforms[2].name.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&uniforms[2].name,"dvec2","");
        uniforms[2].expected_type = 0x8ffc;
        uniforms[2].location = (p_Var3->uniforms).uniform_location_dvec2;
        uniforms[3].expected_array_size = 2;
        uniforms[3].name._M_dataplus._M_p = (pointer)local_500;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&uniforms[3].name,"dvec2_arr[0]","");
        uniforms[3].expected_type = 0x8ffc;
        uniforms[3].location = (p_Var3->uniforms).uniform_location_dvec2_arr[0];
        uniforms[4].expected_array_size = 1;
        uniforms[4].name._M_dataplus._M_p = (pointer)&uniforms[4].name.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&uniforms[4].name,"dvec3","");
        uniforms[4].expected_type = 0x8ffd;
        uniforms[4].location = (p_Var3->uniforms).uniform_location_dvec3;
        uniforms[5].expected_array_size = 2;
        uniforms[5].name._M_dataplus._M_p = (pointer)&uniforms[5].name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&uniforms[5].name,"dvec3_arr[0]","");
        uniforms[5].expected_type = 0x8ffd;
        uniforms[5].location = (p_Var3->uniforms).uniform_location_dvec3_arr[0];
        uniforms[6].expected_array_size = 1;
        uniforms[6].name._M_dataplus._M_p = (pointer)&uniforms[6].name.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&uniforms[6].name,"dvec4","");
        uniforms[6].expected_type = 0x8ffe;
        uniforms[6].location = (p_Var3->uniforms).uniform_location_dvec4;
        uniforms[7].expected_array_size = 2;
        uniforms[7].name._M_dataplus._M_p = (pointer)&uniforms[7].name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&uniforms[7].name,"dvec4_arr[0]","");
        uniforms[7].expected_type = 0x8ffe;
        uniforms[7].location = (p_Var3->uniforms).uniform_location_dvec4_arr[0];
        uniforms[8].expected_array_size = 1;
        uniforms[8].name._M_dataplus._M_p = (pointer)&uniforms[8].name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&uniforms[8].name,"array[0].struct_double","");
        uniforms[8].expected_type = 0x140a;
        uniforms[8].location = p_Var3->uniform_structure_arrays[0].uniform_location_double;
        uniforms[9].expected_array_size = 1;
        uniforms[9].name._M_dataplus._M_p = (pointer)&uniforms[9].name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&uniforms[9].name,"array[0].struct_dvec2","");
        uniforms[9].expected_type = 0x8ffc;
        uniforms[9].location = p_Var3->uniform_structure_arrays[0].uniform_location_dvec2;
        uniforms[10].expected_array_size = 1;
        uniforms[10].name._M_dataplus._M_p = (pointer)&uniforms[10].name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&uniforms[10].name,"array[0].struct_dvec3","");
        uniforms[10].expected_type = 0x8ffd;
        uniforms[10].location = p_Var3->uniform_structure_arrays[0].uniform_location_dvec3;
        uniforms[0xb].expected_array_size = 1;
        uniforms[0xb].name._M_dataplus._M_p = (pointer)&uniforms[0xb].name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&uniforms[0xb].name,"array[0].struct_dvec4","");
        uniforms[0xb].expected_type = 0x8ffe;
        uniforms[0xb].location = p_Var3->uniform_structure_arrays[0].uniform_location_dvec4;
        uniforms[0xc].expected_array_size = 1;
        uniforms[0xc].name._M_dataplus._M_p = (pointer)&uniforms[0xc].name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&uniforms[0xc].name,"array[1].struct_double","");
        uniforms[0xc].expected_type = 0x140a;
        uniforms[0xc].location = p_Var3->uniform_structure_arrays[0].uniform_location_double;
        uniforms[0xd].expected_array_size = 1;
        uniforms[0xd].name._M_dataplus._M_p = (pointer)&uniforms[0xd].name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&uniforms[0xd].name,"array[1].struct_dvec2","");
        uniforms[0xd].expected_type = 0x8ffc;
        uniforms[0xd].location = p_Var3->uniform_structure_arrays[0].uniform_location_dvec2;
        uniforms[0xe].expected_array_size = 1;
        uniforms[0xe].name._M_dataplus._M_p = (pointer)&uniforms[0xe].name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&uniforms[0xe].name,"array[1].struct_dvec3","");
        uniforms[0xe].expected_type = 0x8ffd;
        uniforms[0xe].location = p_Var3->uniform_structure_arrays[0].uniform_location_dvec3;
        uniforms[0xf].expected_array_size = 1;
        uniforms[0xf].name._M_dataplus._M_p = (pointer)&uniforms[0xf].name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&uniforms[0xf].name,"array[1].struct_dvec4","");
        uniforms[0xf].expected_type = 0x8ffe;
        uniforms[0xf].location = p_Var3->uniform_structure_arrays[0].uniform_location_dvec4;
        lVar21 = 0x10;
        this_01 = (string *)&uniforms[0].name;
        do {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)properties,pcVar13,(allocator<char> *)temp_buffer);
          plVar14 = (long *)std::__cxx11::string::_M_append((char *)properties,*(ulong *)this_01);
          pTVar17 = (TestLog *)(plVar14 + 2);
          if ((TestLog *)*plVar14 == pTVar17) {
            local_1c8.m_log = pTVar17->m_log;
            lStack_1c0 = plVar14[3];
            local_1d8 = (undefined1  [8])&local_1c8;
          }
          else {
            local_1c8.m_log = pTVar17->m_log;
            local_1d8 = (undefined1  [8])*plVar14;
          }
          local_1d0 = (undefined1  [8])plVar14[1];
          *plVar14 = (long)pTVar17;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          std::__cxx11::string::operator=(this_01,(string *)local_1d8);
          if (local_1d8 != (undefined1  [8])&local_1c8) {
            operator_delete((void *)local_1d8,(ulong)((long)&(local_1c8.m_log)->flags + 1));
          }
          if (properties != (GLenum  [2])local_510) {
            operator_delete((void *)properties,local_510[0] + 1);
          }
          this_01 = this_01 + 0x30;
          lVar21 = lVar21 + -1;
        } while (lVar21 != 0);
        properties[0] = 0x92fb;
        properties[1] = 0x92fa;
        lVar21 = 0;
        do {
          n_written_items = 0;
          retrieved_name_length = 0;
          temp_buffer[0] = 0;
          temp_buffer[1] = 0;
          uVar11 = (**(code **)(lVar12 + 0x9a8))
                             (local_548,0x92e1,
                              *(undefined8 *)((long)&uniforms[0].name._M_dataplus._M_p + lVar21));
          dVar10 = (**(code **)(lVar12 + 0x800))();
          glu::checkError(dVar10,"glGetProgramResourceIndex() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                          ,0x1ad2);
          memset(this->m_uniform_name_buffer,0,(long)max_uniform_name_length);
          (**(code **)(lVar12 + 0x9c0))
                    (local_548,0x92e1,uVar11,max_uniform_name_length,&retrieved_name_length,
                     this->m_uniform_name_buffer);
          dVar10 = (**(code **)(lVar12 + 0x800))();
          glu::checkError(dVar10,"glGetProgramResourceName() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                          ,0x1ada);
          if ((*(ulong *)((long)&uniforms[0].name._M_string_length + lVar21) ==
               (ulong)(uint)retrieved_name_length) &&
             (iVar9 = bcmp(this->m_uniform_name_buffer,
                           *(void **)((long)&uniforms[0].name._M_dataplus._M_p + lVar21),
                           (long)retrieved_name_length), iVar9 == 0)) {
            (**(code **)(lVar12 + 0x9c8))
                      (local_548,0x92e1,uVar11,2,properties,2,&n_written_items,temp_buffer);
            dVar10 = (**(code **)(lVar12 + 0x800))();
            glu::checkError(dVar10,"glGetProgramResourceiv() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                            ,0x1aee);
            if (n_written_items != 2) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,
                         "Invalid amount of items were reported by glGetProgramResourceiv() call.",
                         (char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                         ,0x1af2);
              __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            GVar6 = temp_buffer[0];
            GVar7 = temp_buffer[1];
            if (temp_buffer[0] != *(int *)((long)&uniforms[0].expected_array_size + lVar21)) {
              local_1d8 = (undefined1  [8])
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d0,"Invalid array size reported for uniform [",0x29);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d0,
                         *(char **)((long)&uniforms[0].name._M_dataplus._M_p + lVar21),
                         *(long *)((long)&uniforms[0].name._M_string_length + lVar21));
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"]",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d0,": expected:[",0xc);
              std::ostream::operator<<
                        ((ostringstream *)local_1d0,
                         *(int *)((long)&uniforms[0].expected_array_size + lVar21));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d0,"], reported:[",0xd);
              std::ostream::operator<<((ostringstream *)local_1d0,GVar6);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"]",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
              std::ios_base::~ios_base(local_160);
              bVar8 = false;
            }
            if (GVar7 != *(int *)((long)&uniforms[0].expected_type + lVar21)) {
              local_1d8 = (undefined1  [8])
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d0,"Invalid type reported for uniform [",0x23);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d0,
                         *(char **)((long)&uniforms[0].name._M_dataplus._M_p + lVar21),
                         *(long *)((long)&uniforms[0].name._M_string_length + lVar21));
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"]",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d0,": expected:[",0xc);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d0,"], reported:[",0xd);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1d0);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"]",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_0092a10c;
            }
          }
          else {
            local_1d8 = (undefined1  [8])
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d0,"Invalid uniform name was reported at index [",0x2c);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d0,"]: expected:[",0xd);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d0,
                       *(char **)((long)&uniforms[0].name._M_dataplus._M_p + lVar21),
                       *(long *)((long)&uniforms[0].name._M_string_length + lVar21));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d0,"], reported:[",0xd);
            pcVar13 = this->m_uniform_name_buffer;
            if (pcVar13 == (char *)0x0) {
              std::ios::clear((int)*(_func_int **)((long)local_1d0 + -0x18) + (int)local_1d0);
            }
            else {
              sVar15 = strlen(pcVar13);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d0,pcVar13,sVar15);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"]",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0092a10c:
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
            std::ios_base::~ios_base(local_160);
            bVar8 = false;
          }
          lVar21 = lVar21 + 0x30;
        } while (lVar21 != 0x300);
        lVar21 = -0x300;
        paVar18 = &uniforms[0xf].name.field_2;
        do {
          plVar14 = (long *)(((string *)(paVar18 + -1))->_M_dataplus)._M_p;
          if (paVar18 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar14) {
            operator_delete(plVar14,paVar18->_M_allocated_capacity + 1);
          }
          paVar18 = paVar18 + -3;
          lVar21 = lVar21 + 0x30;
        } while (lVar21 != 0);
      } while (((GLuint)local_548 != GVar1) && (uVar16 = local_4e8 + 1, local_4e8 < 4));
      if (this->m_uniform_name_buffer != (char *)0x0) {
        operator_delete__(this->m_uniform_name_buffer);
        this->m_uniform_name_buffer = (char *)0x0;
      }
    }
    bVar4 = !bVar5;
    bVar5 = false;
    uVar20 = uVar2 >> 0x20;
    if (bVar4) {
      return bVar8;
    }
  } while( true );
}

Assistant:

bool GPUShaderFP64Test4::verifyProgramInterfaceQuerySupport()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Iterate through all programs */
	const char*		   cs_prefixes[]	= { "cs_" };
	_stage_data*	   cs_stages[]		= { &m_data_cs };
	const char*		   noncs_prefixes[] = { "fs_", "gs_", "tc_", "te_", "vs_" };
	_stage_data*	   noncs_stages[]   = { &m_data_fs, &m_data_gs, &m_data_tc, &m_data_te, &m_data_vs };
	const unsigned int n_cs_stages		= sizeof(cs_stages) / sizeof(cs_stages[0]);
	const unsigned int n_noncs_stages   = sizeof(noncs_stages) / sizeof(noncs_stages[0]);

	const glw::GLuint  programs[] = { m_po_cs_id, m_po_noncs_id };
	const unsigned int n_programs = sizeof(programs) / sizeof(programs[0]);

	for (unsigned int n_program = 0; n_program < n_programs; ++n_program)
	{
		glw::GLuint   po_id			 = programs[n_program];
		unsigned int  n_stages		 = 0;
		const char**  stage_prefixes = DE_NULL;
		_stage_data** stage_data	 = DE_NULL;

		if (po_id == m_po_cs_id)
		{
			n_stages	   = n_cs_stages;
			stage_data	 = cs_stages;
			stage_prefixes = cs_prefixes;
		}
		else
		{
			n_stages	   = n_noncs_stages;
			stage_data	 = noncs_stages;
			stage_prefixes = noncs_prefixes;
		}

		/* Skip compute shader program if not supported */
		if (0 == po_id)
		{
			continue;
		}

		/* Determine maximum uniform name length */
		glw::GLint max_uniform_name_length = 0;

		gl.getProgramInterfaceiv(po_id, GL_UNIFORM, GL_MAX_NAME_LENGTH, &max_uniform_name_length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInterfaceiv() call failed.");

		/* Allocate a buffer we will use to hold uniform names */
		m_uniform_name_buffer = new char[max_uniform_name_length];

		for (unsigned int n_stage = 0; n_stage < n_stages; ++n_stage)
		{
			/* Iterate through all uniforms */
			_stage_data* stage_ptr	= stage_data[n_stage];
			const char*  stage_prefix = stage_prefixes[n_stage];

			/* Construct an array that will be used to run the test in an automated manner */
			_program_interface_query_test_item uniforms[] = {
				/* array size */ /* name */ /* type */ /* location */
				{ 1, "double", GL_DOUBLE, stage_ptr->uniforms.uniform_location_double },
				{ 2, "double_arr[0]", GL_DOUBLE, stage_ptr->uniforms.uniform_location_double_arr[0] },
				{ 1, "dvec2", GL_DOUBLE_VEC2, stage_ptr->uniforms.uniform_location_dvec2 },
				{ 2, "dvec2_arr[0]", GL_DOUBLE_VEC2, stage_ptr->uniforms.uniform_location_dvec2_arr[0] },
				{ 1, "dvec3", GL_DOUBLE_VEC3, stage_ptr->uniforms.uniform_location_dvec3 },
				{ 2, "dvec3_arr[0]", GL_DOUBLE_VEC3, stage_ptr->uniforms.uniform_location_dvec3_arr[0] },
				{ 1, "dvec4", GL_DOUBLE_VEC4, stage_ptr->uniforms.uniform_location_dvec4 },
				{ 2, "dvec4_arr[0]", GL_DOUBLE_VEC4, stage_ptr->uniforms.uniform_location_dvec4_arr[0] },
				{ 1, "array[0].struct_double", GL_DOUBLE,
				  stage_ptr->uniform_structure_arrays->uniform_location_double },
				{ 1, "array[0].struct_dvec2", GL_DOUBLE_VEC2,
				  stage_ptr->uniform_structure_arrays->uniform_location_dvec2 },
				{ 1, "array[0].struct_dvec3", GL_DOUBLE_VEC3,
				  stage_ptr->uniform_structure_arrays->uniform_location_dvec3 },
				{ 1, "array[0].struct_dvec4", GL_DOUBLE_VEC4,
				  stage_ptr->uniform_structure_arrays->uniform_location_dvec4 },
				{ 1, "array[1].struct_double", GL_DOUBLE,
				  stage_ptr->uniform_structure_arrays->uniform_location_double },
				{ 1, "array[1].struct_dvec2", GL_DOUBLE_VEC2,
				  stage_ptr->uniform_structure_arrays->uniform_location_dvec2 },
				{ 1, "array[1].struct_dvec3", GL_DOUBLE_VEC3,
				  stage_ptr->uniform_structure_arrays->uniform_location_dvec3 },
				{ 1, "array[1].struct_dvec4", GL_DOUBLE_VEC4,
				  stage_ptr->uniform_structure_arrays->uniform_location_dvec4 },
			};
			const unsigned int n_uniforms = sizeof(uniforms) / sizeof(uniforms[0]);

			/* Prefix the names with stage-specific string */
			for (unsigned int n_uniform = 0; n_uniform < n_uniforms; ++n_uniform)
			{
				_program_interface_query_test_item& current_item = uniforms[n_uniform];

				current_item.name = std::string(stage_prefix) + current_item.name;
			} /* for (all uniform descriptors) */

			const glw::GLenum  properties[] = { GL_ARRAY_SIZE, GL_TYPE };
			const unsigned int n_properties = sizeof(properties) / sizeof(properties[0]);

			for (unsigned int n_uniform = 0; n_uniform < n_uniforms; ++n_uniform)
			{
				_program_interface_query_test_item& current_item		  = uniforms[n_uniform];
				glw::GLint							n_written_items		  = 0;
				glw::GLint							retrieved_array_size  = 0;
				glw::GLint							retrieved_name_length = 0;
				glw::GLenum							retrieved_type		  = GL_NONE;
				glw::GLint							temp_buffer[2]		  = { 0, GL_NONE };

				/* Retrieve index of the iteration-specific uniform */
				glw::GLuint resource_index = gl.getProgramResourceIndex(po_id, GL_UNIFORM, current_item.name.c_str());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramResourceIndex() call failed.");

				/* Make sure glGetProgramResourceName() returns correct values */
				memset(m_uniform_name_buffer, 0, max_uniform_name_length);

				gl.getProgramResourceName(po_id, GL_UNIFORM, /* interface */
										  resource_index, max_uniform_name_length, &retrieved_name_length,
										  m_uniform_name_buffer);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramResourceName() call failed.");

				if (current_item.name.length() != (glw::GLuint)retrieved_name_length ||
					memcmp(m_uniform_name_buffer, current_item.name.c_str(), retrieved_name_length) != 0)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid uniform name was reported at index ["
									   << resource_index << "]"
															": expected:["
									   << current_item.name << "]"
															   ", reported:["
									   << m_uniform_name_buffer << "]" << tcu::TestLog::EndMessage;

					result = false;
					continue;
				}

				/* Make sure glGetProgramResourceiv() returns correct values for GL_TYPE and GL_ARRAY_SIZE queries */
				gl.getProgramResourceiv(po_id, GL_UNIFORM, /* interface */
										resource_index, n_properties, properties,
										sizeof(temp_buffer) / sizeof(temp_buffer[0]), &n_written_items, temp_buffer);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramResourceiv() call failed.");

				if (n_written_items != n_properties)
				{
					TCU_FAIL("Invalid amount of items were reported by glGetProgramResourceiv() call.");
				}

				/* For clarity, copy the retrieved values to separate variables */
				retrieved_array_size = temp_buffer[0];
				retrieved_type		 = temp_buffer[1];

				/* Verify the values */
				if (retrieved_array_size != current_item.expected_array_size)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid array size reported for uniform ["
									   << current_item.name << "]"
									   << ": expected:[" << current_item.expected_array_size << "]"
																								", reported:["
									   << retrieved_array_size << "]" << tcu::TestLog::EndMessage;

					result = false;
				}

				if (retrieved_type != current_item.expected_type)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid type reported for uniform ["
									   << current_item.name << "]"
									   << ": expected:[" << current_item.expected_type << "]"
																						  ", reported:["
									   << retrieved_type << "]" << tcu::TestLog::EndMessage;

					result = false;
				}
			} /* for (all uniforms) */
		}	 /* for (all shader stages) */

		/* We're now OK to release the buffer we used to hold uniform names for
		 * the program */
		if (m_uniform_name_buffer != DE_NULL)
		{
			delete[] m_uniform_name_buffer;

			m_uniform_name_buffer = DE_NULL;
		}
	} /* for (both program objects) */

	return result;
}